

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<HashWriter,CTxUndo,std::allocator<CTxUndo>>
               (HashWriter *os,vector<CTxUndo,_std::allocator<CTxUndo>_> *v)

{
  long in_FS_OFFSET;
  Wrapper<VectorFormatter<DefaultFormatter>,_const_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_&>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.m_object = v;
  Wrapper<VectorFormatter<DefaultFormatter>,_const_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_&>
  ::Serialize<HashWriter>(&local_10,os);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}